

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  Extension *pEVar1;
  Descriptor *pDVar2;
  undefined8 uVar3;
  long *in_RDX;
  FieldDescriptor *in_RSI;
  long *in_RDI;
  MessageLite *ret;
  Extension *extension;
  FieldDescriptor *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff10;
  int key;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  ExtensionSet *in_stack_ffffffffffffff20;
  MessageLite *local_c0;
  MessageLite *local_8;
  
  key = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  FieldDescriptor::number(in_RSI);
  pEVar1 = FindOrNull((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                      key);
  if (pEVar1 == (Extension *)0x0) {
    local_8 = (MessageLite *)0x0;
  }
  else {
    if (((byte)pEVar1->field_0xa >> 4 & 1) == 0) {
      local_c0 = (MessageLite *)(pEVar1->field_0).int64_value;
    }
    else {
      pRVar4 = (pEVar1->field_0).repeated_string_value;
      pDVar2 = FieldDescriptor::message_type(in_stack_ffffffffffffff00);
      uVar3 = (**(code **)(*in_RDX + 0x10))(in_RDX,pDVar2);
      local_c0 = (MessageLite *)
                 (*(code *)(((pRVar4->super_RepeatedPtrFieldBase).arena_)->impl_).options_.
                           initial_block_size)(pRVar4,uVar3);
      if ((*in_RDI == 0) &&
         ((pEVar1->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar1->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    FieldDescriptor::number(in_RSI);
    Erase(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_8 = local_c0;
  }
  return local_8;
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    const FieldDescriptor* descriptor, MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->UnsafeArenaReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()));
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      ret = extension->message_value;
    }
    Erase(descriptor->number());
    return ret;
  }
}